

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dconnected.cpp
# Opt level: O2

void __thiscall FilteredLT::DFS(FilteredLT *this,int r)

{
  BoolView *pBVar1;
  bool bVar2;
  
  pBVar1 = (this->p->vs).data;
  if (sat.assigns.data[(uint)pBVar1[(uint)r].v] != '\0') {
    bVar2 = BoolView::isTrue(pBVar1 + (uint)r);
    if (bVar2) {
      this->visited_innodes = this->visited_innodes + 1;
    }
  }
  LengauerTarjan::DFS(&this->super_LengauerTarjan,r);
  return;
}

Assistant:

void FilteredLT::DFS(int r) {
	if (DEBUG) {
		std::cout << "DFS Visiting " << r << " " << p->getNodeVar(r).isFixed()
							<< ((p->getNodeVar(r).isFixed()) ? static_cast<int>(p->getNodeVar(r).isTrue()) : -1)
							<< '\n';
	}
	if (p->getNodeVar(r).isFixed() && p->getNodeVar(r).isTrue()) {
		visited_innodes++;
	}
	LengauerTarjan::DFS(r);
}